

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int nameNsPush(xmlParserCtxtPtr ctxt,xmlChar *value,xmlChar *prefix,xmlChar *URI,int line,int nsNr)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int extraout_EAX;
  xmlStartTag *pxVar4;
  xmlChar **ppxVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar1 = ctxt->nameMax;
  if (ctxt->nameNr < (int)uVar1) {
    if (ctxt->pushTab == (xmlStartTag *)0x0) {
      pxVar4 = (xmlStartTag *)(*xmlMalloc)((long)(int)uVar1 * 0x18);
      ctxt->pushTab = pxVar4;
      if (pxVar4 == (xmlStartTag *)0x0) goto LAB_00144319;
    }
LAB_001442c9:
    iVar2 = ctxt->nameNr;
    ctxt->nameTab[iVar2] = value;
    ctxt->name = value;
    pxVar4 = ctxt->pushTab;
    pxVar4[iVar2].prefix = prefix;
    pxVar4[iVar2].URI = URI;
    pxVar4[iVar2].line = line;
    pxVar4[iVar2].nsNr = nsNr;
    ctxt->nameNr = iVar2 + 1;
    return iVar2 + 1;
  }
  if ((int)uVar1 < 1) {
    uVar7 = 10;
  }
  else {
    if (999999999 < uVar1) goto LAB_00144319;
    uVar6 = uVar1 + 1 >> 1;
    uVar3 = uVar6 + uVar1;
    if (1000000000 - uVar6 < uVar1) {
      uVar3 = 1000000000;
    }
    uVar7 = (ulong)uVar3;
  }
  ppxVar5 = (xmlChar **)(*xmlRealloc)(ctxt->nameTab,uVar7 * 8);
  if (ppxVar5 != (xmlChar **)0x0) {
    ctxt->nameTab = ppxVar5;
    pxVar4 = (xmlStartTag *)(*xmlRealloc)(ctxt->pushTab,uVar7 * 0x18);
    if (pxVar4 != (xmlStartTag *)0x0) {
      ctxt->pushTab = pxVar4;
      ctxt->nameMax = (int)uVar7;
      goto LAB_001442c9;
    }
  }
LAB_00144319:
  xmlCtxtErrMemory(ctxt);
  return extraout_EAX;
}

Assistant:

static int
nameNsPush(xmlParserCtxtPtr ctxt, const xmlChar * value,
           const xmlChar *prefix, const xmlChar *URI, int line, int nsNr)
{
    xmlStartTag *tag;

    if (ctxt->nameNr >= ctxt->nameMax) {
        const xmlChar **tmp;
        xmlStartTag *tmp2;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->nameMax,
                                  sizeof(tmp[0]) + sizeof(tmp2[0]),
                                  10, XML_MAX_ITEMS);
        if (newSize < 0)
            goto mem_error;

        tmp = xmlRealloc(ctxt->nameTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL)
	    goto mem_error;
	ctxt->nameTab = tmp;

        tmp2 = xmlRealloc(ctxt->pushTab, newSize * sizeof(tmp2[0]));
        if (tmp2 == NULL)
	    goto mem_error;
	ctxt->pushTab = tmp2;

        ctxt->nameMax = newSize;
    } else if (ctxt->pushTab == NULL) {
        ctxt->pushTab = xmlMalloc(ctxt->nameMax * sizeof(ctxt->pushTab[0]));
        if (ctxt->pushTab == NULL)
            goto mem_error;
    }
    ctxt->nameTab[ctxt->nameNr] = value;
    ctxt->name = value;
    tag = &ctxt->pushTab[ctxt->nameNr];
    tag->prefix = prefix;
    tag->URI = URI;
    tag->line = line;
    tag->nsNr = nsNr;
    return (ctxt->nameNr++);
mem_error:
    xmlErrMemory(ctxt);
    return (-1);
}